

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

void Am_Error(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"**  Program aborted.");
  std::endl<char,std::char_traits<char>>(poVar1);
  abort();
}

Assistant:

void
Am_Error()
{
#ifdef DEBUG
  if (Am_Debugger)
    Am_Debugger();
#endif

  std::cerr << "**  Program aborted." << std::endl;
#if defined(_WIN32)
  std::cerr << "(press return to exit)" << std::endl;
  getchar();
#endif
  abort();
}